

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char[11]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [11])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char local_98 [32];
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *pcStack_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  char *local_40;
  size_type local_38;
  pointer local_30;
  size_t local_28;
  char (*local_20) [11];
  
  local_78._M_len = (a->View_)._M_len;
  local_78._M_str = (a->View_)._M_str;
  local_68 = (b->View_)._M_len;
  pcStack_60 = (b->View_)._M_str;
  local_50 = (args->_M_dataplus)._M_p;
  local_58 = args->_M_string_length;
  local_98[0] = *args_1;
  local_40 = local_98;
  local_48 = 1;
  local_30 = (args_2->_M_dataplus)._M_p;
  local_38 = args_2->_M_string_length;
  local_28 = strlen(*args_3);
  local_20 = args_3;
  views._M_len = 6;
  views._M_array = &local_78;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}